

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AlignmentRecord.cpp
# Opt level: O1

tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
* __thiscall
AlignmentRecord::referenceString
          (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
           *__return_storage_ptr__,AlignmentRecord *this,
          vector<char,_std::allocator<char>_> *cigarData,int startPosition,string *sequence,
          string *qualities,string *reference)

{
  char cVar1;
  bool bVar2;
  char *pcVar3;
  _Tuple_impl<0ul,std::__cxx11::string,std::__cxx11::string,std::vector<int,std::allocator<int>>>
  *this_00;
  int iVar4;
  pointer pcVar5;
  ulong uVar6;
  char *__end;
  ulong uVar7;
  char cVar8;
  vector<char,_std::allocator<char>_> *__range1;
  ulong uVar9;
  int iVar10;
  vector<int,_std::allocator<int>_> qualityList;
  string replaceString;
  string constructedReference;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  vector<int,_std::allocator<int>_> local_c8;
  iterator_range<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a8;
  char local_98 [16];
  string *local_88;
  undefined1 *local_80;
  char *local_78;
  undefined1 local_70 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  locale local_40 [8];
  _Tuple_impl<0ul,std::__cxx11::string,std::__cxx11::string,std::vector<int,std::allocator<int>>>
  *local_38;
  
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  local_88 = qualities;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"","");
  local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"","");
  local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (int *)0x0;
  local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (int *)0x0;
  pcVar3 = (cigarData->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  do {
    if (pcVar3 == (cigarData->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                  super__Vector_impl_data._M_finish) break;
    if ((*pcVar3 == 'S') || (bVar2 = true, *pcVar3 == 'H')) {
      bVar2 = false;
    }
    pcVar3 = pcVar3 + 1;
  } while (!bVar2);
  local_80 = local_70;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"G","");
  pcVar5 = (cigarData->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  local_38 = (_Tuple_impl<0ul,std::__cxx11::string,std::__cxx11::string,std::vector<int,std::allocator<int>>>
              *)__return_storage_ptr__;
  if ((cigarData->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
      _M_finish != pcVar5) {
    uVar9 = 0;
    iVar10 = 0;
    do {
      cVar8 = (char)&local_e8;
      switch(pcVar5[uVar9]) {
      case 'D':
        std::__cxx11::string::push_back(cVar8);
        local_a8.
        super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::random_access_traversal_tag>
        .
        super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::bidirectional_traversal_tag>
        .
        super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::incrementable_traversal_tag>
        .m_Begin._M_current =
             local_a8.
             super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::random_access_traversal_tag>
             .
             super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::bidirectional_traversal_tag>
             .
             super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::incrementable_traversal_tag>
             .m_Begin._M_current & 0xffffffff00000000;
        if (local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish ==
            local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage) {
          std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                    (&local_c8,
                     (iterator)
                     local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish,(int *)&local_a8);
        }
        else {
          *local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_finish = 0;
          local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish = local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish + 1;
        }
        std::__cxx11::string::push_back((char)&local_60);
        break;
      case 'H':
        std::__cxx11::string::push_back(cVar8);
        if (local_88->_M_string_length <= (ulong)(long)iVar10) {
          std::__throw_out_of_range_fmt
                    ("basic_string::at: __n (which is %zu) >= this->size() (which is %zu)");
        }
        iVar4 = (local_88->_M_dataplus)._M_p[iVar10] + -0x21;
        local_a8.
        super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::random_access_traversal_tag>
        .
        super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::bidirectional_traversal_tag>
        .
        super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::incrementable_traversal_tag>
        .m_Begin._M_current._0_4_ = iVar4;
        if (local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish ==
            local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage) {
          std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                    (&local_c8,
                     (iterator)
                     local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish,(int *)&local_a8);
        }
        else {
          *local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_finish = iVar4;
          local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish = local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish + 1;
        }
        std::__cxx11::string::push_back((char)&local_60);
        iVar10 = iVar10 + 1;
        break;
      case 'I':
        uVar6 = (ulong)iVar10;
        if (sequence->_M_string_length <= uVar6) goto LAB_00165cab;
        std::__cxx11::string::push_back(cVar8);
        if (local_88->_M_string_length <= uVar6) {
          std::__throw_out_of_range_fmt
                    ("basic_string::at: __n (which is %zu) >= this->size() (which is %zu)",uVar6);
        }
        iVar4 = (local_88->_M_dataplus)._M_p[uVar6] + -0x21;
        local_a8.
        super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::random_access_traversal_tag>
        .
        super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::bidirectional_traversal_tag>
        .
        super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::incrementable_traversal_tag>
        .m_Begin._M_current._0_4_ = iVar4;
        if (local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish ==
            local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage) {
          std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                    (&local_c8,
                     (iterator)
                     local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish,(int *)&local_a8);
        }
        else {
          *local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_finish = iVar4;
          local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish = local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish + 1;
        }
        std::__cxx11::string::push_back((char)&local_60);
        iVar10 = iVar10 + 1;
        break;
      case 'M':
        std::__cxx11::string::push_back((char)&local_60);
        if (iVar10 == 0) {
LAB_001659f4:
          uVar6 = (ulong)iVar10;
          if (sequence->_M_string_length <= uVar6) {
LAB_00165cab:
            std::__throw_out_of_range_fmt
                      ("basic_string::at: __n (which is %zu) >= this->size() (which is %zu)",uVar6);
          }
          std::__cxx11::string::push_back(cVar8);
        }
        else {
          uVar7 = (ulong)iVar10;
          uVar6 = uVar7;
          if (sequence->_M_string_length <= uVar7) goto LAB_00165cab;
          cVar1 = (sequence->_M_dataplus)._M_p[uVar7];
          if ((cVar1 != 'T') && (cVar1 != 'C')) goto LAB_001659f4;
          uVar6 = local_e8._M_string_length - 1;
          if (local_e8._M_string_length == 0) goto LAB_00165cab;
          if (local_e8._M_dataplus._M_p[uVar6] == 'G') goto LAB_001659f4;
          if (local_60._M_string_length <= uVar6) goto LAB_00165cab;
          if (local_60._M_dataplus._M_p[uVar6] != 'G') goto LAB_001659f4;
          std::__cxx11::string::substr((ulong)&local_a8,(ulong)&local_e8);
          std::__cxx11::string::operator=((string *)&local_e8,(string *)&local_a8);
          if (local_a8.
              super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::random_access_traversal_tag>
              .
              super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::bidirectional_traversal_tag>
              .
              super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::incrementable_traversal_tag>
              .m_Begin._M_current != local_98) {
            operator_delete(local_a8.
                            super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::random_access_traversal_tag>
                            .
                            super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::bidirectional_traversal_tag>
                            .
                            super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::incrementable_traversal_tag>
                            .m_Begin._M_current);
          }
          std::__cxx11::string::append((char *)&local_e8);
          uVar6 = uVar7;
          if ((sequence->_M_string_length <= uVar7) ||
             (std::__cxx11::string::push_back(cVar8), sequence->_M_string_length <= uVar7))
          goto LAB_00165cab;
          std::__cxx11::string::push_back((char)&local_80);
          std::__cxx11::string::replace
                    ((ulong)sequence,(long)(iVar10 + -1),(char *)0x2,(ulong)local_80);
          std::__cxx11::string::_M_replace((ulong)&local_80,0,local_78,0x19b4e2);
        }
        if (local_88->_M_string_length <= (ulong)(long)iVar10) {
          std::__throw_out_of_range_fmt
                    ("basic_string::at: __n (which is %zu) >= this->size() (which is %zu)");
        }
        iVar4 = (local_88->_M_dataplus)._M_p[iVar10] + -0x21;
        local_a8.
        super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::random_access_traversal_tag>
        .
        super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::bidirectional_traversal_tag>
        .
        super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::incrementable_traversal_tag>
        .m_Begin._M_current._0_4_ = iVar4;
        if (local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish ==
            local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage) {
          std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                    (&local_c8,
                     (iterator)
                     local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish,(int *)&local_a8);
        }
        else {
LAB_00165aab:
          *local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_finish = iVar4;
          local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish = local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish + 1;
        }
        goto LAB_00165ab6;
      case 'N':
        std::__cxx11::string::push_back((char)&local_60);
        if (iVar10 == 0) {
LAB_00165a56:
          uVar6 = (long)iVar10;
          if (sequence->_M_string_length <= (ulong)(long)iVar10) goto LAB_00165cab;
          std::__cxx11::string::push_back(cVar8);
        }
        else {
          uVar7 = (ulong)iVar10;
          uVar6 = uVar7;
          if (sequence->_M_string_length <= uVar7) goto LAB_00165cab;
          cVar1 = (sequence->_M_dataplus)._M_p[uVar7];
          if ((cVar1 != 'T') && (cVar1 != 'C')) goto LAB_00165a56;
          uVar6 = local_e8._M_string_length - 1;
          if (local_e8._M_string_length == 0) goto LAB_00165cab;
          if (local_e8._M_dataplus._M_p[uVar6] == 'G') goto LAB_00165a56;
          if (local_60._M_string_length <= uVar6) goto LAB_00165cab;
          if (local_60._M_dataplus._M_p[uVar6] != 'G') goto LAB_00165a56;
          std::__cxx11::string::substr((ulong)&local_a8,(ulong)&local_e8);
          std::__cxx11::string::operator=((string *)&local_e8,(string *)&local_a8);
          if (local_a8.
              super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::random_access_traversal_tag>
              .
              super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::bidirectional_traversal_tag>
              .
              super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::incrementable_traversal_tag>
              .m_Begin._M_current != local_98) {
            operator_delete(local_a8.
                            super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::random_access_traversal_tag>
                            .
                            super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::bidirectional_traversal_tag>
                            .
                            super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::incrementable_traversal_tag>
                            .m_Begin._M_current);
          }
          std::__cxx11::string::append((char *)&local_e8);
          uVar6 = uVar7;
          if ((sequence->_M_string_length <= uVar7) ||
             (std::__cxx11::string::push_back(cVar8), sequence->_M_string_length <= uVar7))
          goto LAB_00165cab;
          std::__cxx11::string::push_back((char)&local_80);
          std::__cxx11::string::replace
                    ((ulong)sequence,(long)(iVar10 + -1),(char *)0x2,(ulong)local_80);
          std::__cxx11::string::_M_replace((ulong)&local_80,0,local_78,0x19b4e2);
        }
        if (local_88->_M_string_length <= (ulong)(long)iVar10) {
          std::__throw_out_of_range_fmt
                    ("basic_string::at: __n (which is %zu) >= this->size() (which is %zu)");
        }
        iVar4 = (local_88->_M_dataplus)._M_p[iVar10] + -0x21;
        local_a8.
        super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::random_access_traversal_tag>
        .
        super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::bidirectional_traversal_tag>
        .
        super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::incrementable_traversal_tag>
        .m_Begin._M_current._0_4_ = iVar4;
        if (local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish !=
            local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage) goto LAB_00165aab;
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  (&local_c8,
                   (iterator)
                   local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish,(int *)&local_a8);
        goto LAB_00165ab6;
      case 'P':
        std::__cxx11::string::push_back((char)&local_60);
        if (iVar10 == 0) {
LAB_00165926:
          uVar6 = (long)iVar10;
          if (sequence->_M_string_length <= (ulong)(long)iVar10) goto LAB_00165cab;
          std::__cxx11::string::push_back(cVar8);
        }
        else {
          uVar7 = (ulong)iVar10;
          uVar6 = uVar7;
          if (sequence->_M_string_length <= uVar7) goto LAB_00165cab;
          cVar1 = (sequence->_M_dataplus)._M_p[uVar7];
          if ((cVar1 != 'T') && (cVar1 != 'C')) goto LAB_00165926;
          uVar6 = local_e8._M_string_length - 1;
          if (local_e8._M_string_length == 0) goto LAB_00165cab;
          if (local_e8._M_dataplus._M_p[uVar6] == 'G') goto LAB_00165926;
          if (local_60._M_string_length <= uVar6) goto LAB_00165cab;
          if (local_60._M_dataplus._M_p[uVar6] != 'G') goto LAB_00165926;
          std::__cxx11::string::substr((ulong)&local_a8,(ulong)&local_e8);
          std::__cxx11::string::operator=((string *)&local_e8,(string *)&local_a8);
          if (local_a8.
              super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::random_access_traversal_tag>
              .
              super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::bidirectional_traversal_tag>
              .
              super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::incrementable_traversal_tag>
              .m_Begin._M_current != local_98) {
            operator_delete(local_a8.
                            super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::random_access_traversal_tag>
                            .
                            super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::bidirectional_traversal_tag>
                            .
                            super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::incrementable_traversal_tag>
                            .m_Begin._M_current);
          }
          std::__cxx11::string::append((char *)&local_e8);
          uVar6 = uVar7;
          if ((sequence->_M_string_length <= uVar7) ||
             (std::__cxx11::string::push_back(cVar8), sequence->_M_string_length <= uVar7))
          goto LAB_00165cab;
          std::__cxx11::string::push_back((char)&local_80);
          std::__cxx11::string::replace
                    ((ulong)sequence,(long)(iVar10 + -1),(char *)0x2,(ulong)local_80);
          std::__cxx11::string::_M_replace((ulong)&local_80,0,local_78,0x19b4e2);
        }
        if (local_88->_M_string_length <= (ulong)(long)iVar10) {
          std::__throw_out_of_range_fmt
                    ("basic_string::at: __n (which is %zu) >= this->size() (which is %zu)");
        }
        iVar4 = (local_88->_M_dataplus)._M_p[iVar10] + -0x21;
        local_a8.
        super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::random_access_traversal_tag>
        .
        super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::bidirectional_traversal_tag>
        .
        super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::incrementable_traversal_tag>
        .m_Begin._M_current._0_4_ = iVar4;
        if (local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish !=
            local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage) goto LAB_00165aab;
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  (&local_c8,
                   (iterator)
                   local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish,(int *)&local_a8);
LAB_00165ab6:
        iVar10 = iVar10 + 1;
        break;
      case 'S':
        std::__cxx11::string::push_back((char)&local_60);
        if (iVar10 == 0) {
LAB_0016598f:
          uVar6 = (long)iVar10;
          if (sequence->_M_string_length <= (ulong)(long)iVar10) goto LAB_00165cab;
          std::__cxx11::string::push_back(cVar8);
        }
        else {
          uVar7 = (ulong)iVar10;
          uVar6 = uVar7;
          if (sequence->_M_string_length <= uVar7) goto LAB_00165cab;
          cVar1 = (sequence->_M_dataplus)._M_p[uVar7];
          if ((cVar1 != 'T') && (cVar1 != 'C')) goto LAB_0016598f;
          uVar6 = local_e8._M_string_length - 1;
          if (local_e8._M_string_length == 0) goto LAB_00165cab;
          if (local_e8._M_dataplus._M_p[uVar6] == 'G') goto LAB_0016598f;
          if (local_60._M_string_length <= uVar6) goto LAB_00165cab;
          if (local_60._M_dataplus._M_p[uVar6] != 'G') goto LAB_0016598f;
          std::__cxx11::string::substr((ulong)&local_a8,(ulong)&local_e8);
          std::__cxx11::string::operator=((string *)&local_e8,(string *)&local_a8);
          if (local_a8.
              super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::random_access_traversal_tag>
              .
              super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::bidirectional_traversal_tag>
              .
              super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::incrementable_traversal_tag>
              .m_Begin._M_current != local_98) {
            operator_delete(local_a8.
                            super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::random_access_traversal_tag>
                            .
                            super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::bidirectional_traversal_tag>
                            .
                            super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::incrementable_traversal_tag>
                            .m_Begin._M_current);
          }
          std::__cxx11::string::append((char *)&local_e8);
          uVar6 = uVar7;
          if ((sequence->_M_string_length <= uVar7) ||
             (std::__cxx11::string::push_back(cVar8), sequence->_M_string_length <= uVar7))
          goto LAB_00165cab;
          std::__cxx11::string::push_back((char)&local_80);
          std::__cxx11::string::replace
                    ((ulong)sequence,(long)(iVar10 + -1),(char *)0x2,(ulong)local_80);
          std::__cxx11::string::_M_replace((ulong)&local_80,0,local_78,0x19b4e2);
        }
        if (local_88->_M_string_length <= (ulong)(long)iVar10) {
          std::__throw_out_of_range_fmt
                    ("basic_string::at: __n (which is %zu) >= this->size() (which is %zu)");
        }
        iVar4 = (local_88->_M_dataplus)._M_p[iVar10] + -0x21;
        local_a8.
        super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::random_access_traversal_tag>
        .
        super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::bidirectional_traversal_tag>
        .
        super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::incrementable_traversal_tag>
        .m_Begin._M_current._0_4_ = iVar4;
        if (local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish ==
            local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage) {
          std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                    (&local_c8,
                     (iterator)
                     local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish,(int *)&local_a8);
        }
        else {
          *local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_finish = iVar4;
          local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish = local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish + 1;
        }
        iVar10 = iVar10 + 1;
      }
      uVar9 = uVar9 + 1;
      pcVar5 = (cigarData->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
               super__Vector_impl_data._M_start;
    } while (uVar9 < (ulong)((long)(cigarData->super__Vector_base<char,_std::allocator<char>_>).
                                   _M_impl.super__Vector_impl_data._M_finish - (long)pcVar5));
  }
  std::__cxx11::string::push_back((char)&local_60);
  this_00 = local_38;
  std::locale::locale(local_40);
  local_a8.
  super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::random_access_traversal_tag>
  .
  super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::bidirectional_traversal_tag>
  .
  super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::incrementable_traversal_tag>
  .m_End._M_current = local_60._M_dataplus._M_p + local_60._M_string_length;
  local_a8.
  super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::random_access_traversal_tag>
  .
  super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::bidirectional_traversal_tag>
  .
  super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::incrementable_traversal_tag>
  .m_Begin._M_current = local_60._M_dataplus._M_p;
  boost::algorithm::detail::
  transform_range<boost::iterator_range<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>,boost::algorithm::detail::to_upperF<char>>
            (&local_a8,local_40);
  std::locale::~locale(local_40);
  std::locale::locale(local_40);
  local_a8.
  super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::random_access_traversal_tag>
  .
  super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::bidirectional_traversal_tag>
  .
  super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::incrementable_traversal_tag>
  .m_End._M_current = local_e8._M_dataplus._M_p + local_e8._M_string_length;
  local_a8.
  super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::random_access_traversal_tag>
  .
  super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::bidirectional_traversal_tag>
  .
  super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::incrementable_traversal_tag>
  .m_Begin._M_current = local_e8._M_dataplus._M_p;
  boost::algorithm::detail::
  transform_range<boost::iterator_range<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>,boost::algorithm::detail::to_upperF<char>>
            (&local_a8,local_40);
  std::locale::~locale(local_40);
  std::
  _Tuple_impl<0ul,std::__cxx11::string,std::__cxx11::string,std::vector<int,std::allocator<int>>>::
  _Tuple_impl<std::__cxx11::string&,std::__cxx11::string&,std::vector<int,std::allocator<int>>&,void>
            (this_00,&local_60,&local_e8,&local_c8);
  if (local_80 != local_70) {
    operator_delete(local_80);
  }
  if (local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
    operator_delete(local_e8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  return (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
          *)this_00;
}

Assistant:

std::tuple<string,string,vector<int>> AlignmentRecord::referenceString(const std::vector<char> cigarData, int startPosition, std::string& sequence, string  qualities, string & reference){

    string constructedReference = "";
    string alignSeq="";
    vector<int> qualityList;
    int referenceCounter = startPosition-computeOffset(cigarData);
    int sequenceCounter=0;//this is the quality counter as well
    string replaceString = "G";

    for ( int s = 0; s < cigarData.size(); s++) {
        if (cigarData[s] == 'I') {
            alignSeq+=sequence.at(sequenceCounter);
            qualityList.push_back(qualities.at(sequenceCounter)-33);
            sequenceCounter++;
            constructedReference +='I';
        }else if (cigarData[s] == 'D'){
            alignSeq+='D';
            qualityList.push_back(0);
            constructedReference += (reference)[referenceCounter];
            referenceCounter++;
        }else if (cigarData[s] == 'S'){
            constructedReference += (reference)[referenceCounter];
            //Correcting GC position errors in the reads by checking the reference
            if(sequenceCounter!=0 && (sequence.at(sequenceCounter)=='C' || sequence.at(sequenceCounter)=='T') && (alignSeq.at(alignSeq.size()-1)!='G' && constructedReference.at(alignSeq.size()-1)=='G')){
                alignSeq = alignSeq.substr(0,alignSeq.size()-1);
                alignSeq += "G";
                alignSeq += sequence.at(sequenceCounter);
                replaceString += sequence.at(sequenceCounter);
                sequence.replace(sequenceCounter-1,2,replaceString);
                replaceString = "G";
            }else{
                alignSeq+=sequence.at(sequenceCounter);
            }
            qualityList.push_back(qualities.at(sequenceCounter)-33);
            referenceCounter++;
            sequenceCounter++;
        }else if (cigarData[s] == 'H'){
            alignSeq+='H';
            qualityList.push_back(qualities.at(sequenceCounter)-33);
            constructedReference += 'H';
            sequenceCounter++;
            referenceCounter++;
        }else if (cigarData[s] == 'M') {
            constructedReference += (reference)[referenceCounter];
            //Correcting GC position errors in the reads by checking the reference
            if(sequenceCounter!=0 && (sequence.at(sequenceCounter)=='C' || sequence.at(sequenceCounter)=='T') && (alignSeq.at(alignSeq.size()-1)!='G' && constructedReference.at(alignSeq.size()-1)=='G')){
                alignSeq = alignSeq.substr(0,alignSeq.size()-1);
                alignSeq += "G";
                alignSeq += sequence.at(sequenceCounter);
                replaceString += sequence.at(sequenceCounter);
                sequence.replace(sequenceCounter-1,2,replaceString);
                replaceString = "G";
            }else{
                alignSeq+=sequence.at(sequenceCounter);
            }
            qualityList.push_back(qualities.at(sequenceCounter)-33);
            sequenceCounter++;
            referenceCounter++;
        }else if (cigarData[s] == 'N') {
            constructedReference += (reference)[referenceCounter];
            //Correcting GC position errors in the reads by checking the reference
            if(sequenceCounter!=0 && (sequence.at(sequenceCounter)=='C' || sequence.at(sequenceCounter)=='T') && (alignSeq.at(alignSeq.size()-1)!='G' && constructedReference.at(alignSeq.size()-1)=='G')){
                alignSeq = alignSeq.substr(0,alignSeq.size()-1);
                alignSeq += "G";
                alignSeq += sequence.at(sequenceCounter);
                replaceString += sequence.at(sequenceCounter);
                sequence.replace(sequenceCounter-1,2,replaceString);
                replaceString = "G";
            }else{
                alignSeq+=sequence.at(sequenceCounter);
            }
            qualityList.push_back(qualities.at(sequenceCounter)-33);
            sequenceCounter++;
            referenceCounter++;
        }else if (cigarData[s] == 'P') {
            constructedReference += (reference)[referenceCounter];
            //Correcting GC position errors in the reads by checking the reference
            if(sequenceCounter!=0 && (sequence.at(sequenceCounter)=='C' || sequence.at(sequenceCounter)=='T') && (alignSeq.at(alignSeq.size()-1)!='G' && constructedReference.at(alignSeq.size()-1)=='G')){
                alignSeq = alignSeq.substr(0,alignSeq.size()-1);
                alignSeq += "G";
                alignSeq += sequence.at(sequenceCounter);
                replaceString += sequence.at(sequenceCounter);
                sequence.replace(sequenceCounter-1,2,replaceString);
                replaceString = "G";
            }else{
                alignSeq+=sequence.at(sequenceCounter);
            }
            qualityList.push_back(qualities.at(sequenceCounter)-33);
            sequenceCounter++;
            referenceCounter++;
        }else {
            assert(false);
        }
    }
    constructedReference+=reference[referenceCounter];


    if(cigarData.size()!=constructedReference.size()-1){
        assert(false);
    }
    boost::algorithm::to_upper(constructedReference);
    boost::algorithm::to_upper(alignSeq);
    return std::make_tuple(constructedReference,alignSeq,qualityList);

}